

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pools.cpp
# Opt level: O0

IStrategy * __thiscall xmrig::Pools::createStrategy(Pools *this,IStrategyListener *listener)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  IStrategy *pIVar5;
  undefined1 quiet;
  Pool *listener_00;
  Pools *in_RDI;
  Pool *pool_1;
  const_iterator __end1;
  const_iterator __begin1;
  vector<xmrig::Pool,_std::allocator<xmrig::Pool>_> *__range1;
  FailoverStrategy *strategy;
  Pool *pool;
  const_iterator __end2;
  const_iterator __begin2;
  vector<xmrig::Pool,_std::allocator<xmrig::Pool>_> *__range2;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  Pool *in_stack_ffffffffffffff60;
  Pool *this_00;
  int in_stack_ffffffffffffff6c;
  FailoverStrategy *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined8 in_stack_ffffffffffffff90;
  Pool *in_stack_ffffffffffffff98;
  __normal_iterator<const_xmrig::Pool_*,_std::vector<xmrig::Pool,_std::allocator<xmrig::Pool>_>_>
  in_stack_ffffffffffffffa0;
  __normal_iterator<const_xmrig::Pool_*,_std::vector<xmrig::Pool,_std::allocator<xmrig::Pool>_>_>
  local_28;
  vector<xmrig::Pool,_std::allocator<xmrig::Pool>_> *local_20;
  
  sVar4 = active((Pools *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  if (sVar4 == 1) {
    local_20 = &in_RDI->m_data;
    local_28._M_current =
         (Pool *)std::vector<xmrig::Pool,_std::allocator<xmrig::Pool>_>::begin
                           ((vector<xmrig::Pool,_std::allocator<xmrig::Pool>_> *)
                            CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    std::vector<xmrig::Pool,_std::allocator<xmrig::Pool>_>::end
              ((vector<xmrig::Pool,_std::allocator<xmrig::Pool>_> *)
               CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_xmrig::Pool_*,_std::vector<xmrig::Pool,_std::allocator<xmrig::Pool>_>_>
                               *)in_stack_ffffffffffffff60,
                              (__normal_iterator<const_xmrig::Pool_*,_std::vector<xmrig::Pool,_std::allocator<xmrig::Pool>_>_>
                               *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58)),
          bVar1) {
      __gnu_cxx::
      __normal_iterator<const_xmrig::Pool_*,_std::vector<xmrig::Pool,_std::allocator<xmrig::Pool>_>_>
      ::operator*(&local_28);
      bVar1 = Pool::isEnabled(in_stack_ffffffffffffff60);
      if (bVar1) {
        pIVar5 = (IStrategy *)operator_new(0x28);
        iVar2 = retryPause(in_RDI);
        quiet = (undefined1)((uint)iVar2 >> 0x18);
        retries(in_RDI);
        SinglePoolStrategy::SinglePoolStrategy
                  ((SinglePoolStrategy *)in_stack_ffffffffffffffa0._M_current,
                   in_stack_ffffffffffffff98,(int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                   (int)in_stack_ffffffffffffff90,(IStrategyListener *)in_RDI,(bool)quiet);
        return pIVar5;
      }
      __gnu_cxx::
      __normal_iterator<const_xmrig::Pool_*,_std::vector<xmrig::Pool,_std::allocator<xmrig::Pool>_>_>
      ::operator++(&local_28);
    }
  }
  listener_00 = (Pool *)operator_new(0x48);
  iVar2 = retryPause(in_RDI);
  iVar3 = retries(in_RDI);
  FailoverStrategy::FailoverStrategy
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff6c,iVar2,
             (IStrategyListener *)listener_00,SUB41((uint)iVar3 >> 0x18,0));
  this_00 = listener_00;
  std::vector<xmrig::Pool,_std::allocator<xmrig::Pool>_>::begin
            ((vector<xmrig::Pool,_std::allocator<xmrig::Pool>_> *)
             CONCAT44(iVar3,in_stack_ffffffffffffff58));
  std::vector<xmrig::Pool,_std::allocator<xmrig::Pool>_>::end
            ((vector<xmrig::Pool,_std::allocator<xmrig::Pool>_> *)
             CONCAT44(iVar3,in_stack_ffffffffffffff58));
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_xmrig::Pool_*,_std::vector<xmrig::Pool,_std::allocator<xmrig::Pool>_>_>
                             *)this_00,
                            (__normal_iterator<const_xmrig::Pool_*,_std::vector<xmrig::Pool,_std::allocator<xmrig::Pool>_>_>
                             *)CONCAT44(iVar3,in_stack_ffffffffffffff58)), bVar1) {
    __gnu_cxx::
    __normal_iterator<const_xmrig::Pool_*,_std::vector<xmrig::Pool,_std::allocator<xmrig::Pool>_>_>
    ::operator*((__normal_iterator<const_xmrig::Pool_*,_std::vector<xmrig::Pool,_std::allocator<xmrig::Pool>_>_>
                 *)&stack0xffffffffffffffa0);
    bVar1 = Pool::isEnabled(this_00);
    if (bVar1) {
      FailoverStrategy::add
                (in_stack_ffffffffffffff70,(Pool *)CONCAT44(in_stack_ffffffffffffff6c,iVar2));
    }
    __gnu_cxx::
    __normal_iterator<const_xmrig::Pool_*,_std::vector<xmrig::Pool,_std::allocator<xmrig::Pool>_>_>
    ::operator++((__normal_iterator<const_xmrig::Pool_*,_std::vector<xmrig::Pool,_std::allocator<xmrig::Pool>_>_>
                  *)&stack0xffffffffffffffa0);
  }
  return (IStrategy *)listener_00;
}

Assistant:

xmrig::IStrategy *xmrig::Pools::createStrategy(IStrategyListener *listener) const
{
    if (active() == 1) {
        for (const Pool &pool : m_data) {
            if (pool.isEnabled()) {
                return new SinglePoolStrategy(pool, retryPause(), retries(), listener);
            }
        }
    }

    auto strategy = new FailoverStrategy(retryPause(), retries(), listener);
    for (const Pool &pool : m_data) {
        if (pool.isEnabled()) {
            strategy->add(pool);
        }
    }

    return strategy;
}